

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnImportException
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index except_index,TypeVector *sig)

{
  Module *this_00;
  pointer pEVar1;
  Location local_c0;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_a0;
  string local_98;
  string local_68;
  unique_ptr<wabt::ExceptionImport,_std::default_delete<wabt::ExceptionImport>_> local_48;
  unique_ptr<wabt::ExceptionImport,_std::default_delete<wabt::ExceptionImport>_> import;
  Index import_index_local;
  BinaryReaderIR *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local.data_ = (char *)field_name.size_;
  this_local = (BinaryReaderIR *)field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  field_name_local.size_ = (size_type)module_name.data_;
  import._M_t.
  super___uniq_ptr_impl<wabt::ExceptionImport,_std::default_delete<wabt::ExceptionImport>_>._M_t.
  super__Tuple_impl<0UL,_wabt::ExceptionImport_*,_std::default_delete<wabt::ExceptionImport>_>.
  super__Head_base<0UL,_wabt::ExceptionImport_*,_false>._M_head_impl._4_4_ = import_index;
  MakeUnique<wabt::ExceptionImport>();
  string_view::to_string_abi_cxx11_(&local_68,(string_view *)&field_name_local.size_);
  pEVar1 = std::unique_ptr<wabt::ExceptionImport,_std::default_delete<wabt::ExceptionImport>_>::
           operator->(&local_48);
  std::__cxx11::string::operator=
            ((string *)&(pEVar1->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.module_name,
             (string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  string_view::to_string_abi_cxx11_(&local_98,(string_view *)&this_local);
  pEVar1 = std::unique_ptr<wabt::ExceptionImport,_std::default_delete<wabt::ExceptionImport>_>::
           operator->(&local_48);
  std::__cxx11::string::operator=
            ((string *)&(pEVar1->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.field_name,
             (string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  pEVar1 = std::unique_ptr<wabt::ExceptionImport,_std::default_delete<wabt::ExceptionImport>_>::
           operator->(&local_48);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=(&(pEVar1->except).sig,sig);
  this_00 = this->module_;
  GetLocation(&local_c0,this);
  MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::ExceptionImport,std::default_delete<wabt::ExceptionImport>>,wabt::Location>
            ((wabt *)&local_a0,&local_48,&local_c0);
  Module::AppendField(this_00,&local_a0);
  std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
  ~unique_ptr(&local_a0);
  Result::Result((Result *)((long)&module_name_local.size_ + 4),Ok);
  std::unique_ptr<wabt::ExceptionImport,_std::default_delete<wabt::ExceptionImport>_>::~unique_ptr
            (&local_48);
  return (Result)module_name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderIR::OnImportException(Index import_index,
                                         string_view module_name,
                                         string_view field_name,
                                         Index except_index,
                                         TypeVector& sig) {
  auto import = MakeUnique<ExceptionImport>();
  import->module_name = module_name.to_string();
  import->field_name = field_name.to_string();
  import->except.sig = sig;
  module_->AppendField(
      MakeUnique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}